

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O0

FabArray<amrex::BaseFab<long>_> *
amrex::cast<amrex::FabArray<amrex::BaseFab<long>>,amrex::iMultiFab>(iMultiFab *mf_in)

{
  bool bVar1;
  int iVar2;
  BoxArray *pBVar3;
  FabArrayBase *fabarray_;
  long lVar4;
  long *plVar5;
  int *piVar6;
  FabArrayBase *in_RSI;
  FabArray<amrex::BaseFab<long>_> *in_RDI;
  Long i;
  int *psrc;
  long *pdst;
  Long n;
  MFIter mfi;
  FabArray<amrex::BaseFab<long>_> *mf_out;
  MFIter *mfi_00;
  FabArray<amrex::BaseFab<long>_> *in_stack_fffffffffffffeb0;
  MFIter *this;
  FabArray<amrex::BaseFab<long>_> *this_00;
  uchar flags_;
  undefined4 in_stack_fffffffffffffee0;
  long local_110;
  FabArrayBase *in_stack_ffffffffffffff38;
  IntVect *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  DistributionMapping *in_stack_ffffffffffffff50;
  BoxArray *in_stack_ffffffffffffff58;
  FabArray<amrex::BaseFab<long>_> *in_stack_ffffffffffffff60;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  undefined1 local_60 [48];
  int local_30 [3];
  Vector<int,_std::allocator<int>_> *local_20;
  int local_18;
  undefined1 local_11;
  FabArrayBase *local_10;
  
  local_11 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  pBVar3 = FabArrayBase::boxArray(in_RSI);
  flags_ = (uchar)((ulong)pBVar3 >> 0x38);
  fabarray_ = (FabArrayBase *)FabArrayBase::DistributionMap(local_10);
  iVar2 = FabArrayBase::nComp(local_10);
  local_30 = (int  [3])FabArrayBase::nGrowVect(local_10);
  local_18 = local_30[2];
  local_20 = (Vector<int,_std::allocator<int>_> *)local_30._0_8_;
  local_60._24_4_ = 0;
  local_60[0x1c] = '\0';
  local_60._29_3_ = 0;
  local_60._32_4_ = 0;
  local_60._36_4_ = 0;
  local_60._8_8_ = (FabArrayBase *)0x0;
  local_60._16_4_ = 0;
  local_60._20_4_ = 0;
  local_60._40_4_ = 0;
  local_60._44_4_ = 0;
  MFInfo::MFInfo((MFInfo *)0x10423cc);
  local_60._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi_00 = (MFIter *)local_60;
  DefaultFabFactory<amrex::BaseFab<long>_>::DefaultFabFactory
            ((DefaultFabFactory<amrex::BaseFab<long>_> *)in_stack_fffffffffffffeb0);
  this = mfi_00;
  FabArray<amrex::BaseFab<long>_>::FabArray
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,(MFInfo *)in_stack_ffffffffffffff38
             ,(FabFactory<amrex::BaseFab<long>_> *)in_stack_ffffffffffffff70);
  DefaultFabFactory<amrex::BaseFab<long>_>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::BaseFab<long>_> *)0x1042429);
  MFInfo::~MFInfo((MFInfo *)0x1042436);
  MFIter::MFIter((MFIter *)CONCAT44(iVar2,in_stack_fffffffffffffee0),fabarray_,flags_);
  while (bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffff30), bVar1) {
    MFIter::fabbox(this);
    in_stack_fffffffffffffeb0 = (FabArray<amrex::BaseFab<long>_> *)Box::numPts((Box *)this);
    iVar2 = FabArrayBase::nComp(local_10);
    lVar4 = (long)in_stack_fffffffffffffeb0 * (long)iVar2;
    FabArray<amrex::BaseFab<long>_>::operator[](in_stack_fffffffffffffeb0,mfi_00);
    plVar5 = BaseFab<long>::dataPtr((BaseFab<long> *)this_00,(int)((ulong)this >> 0x20));
    FabArray<amrex::IArrayBox>::operator[]
              ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffffeb0,mfi_00);
    piVar6 = BaseFab<int>::dataPtr((BaseFab<int> *)this_00,(int)((ulong)this >> 0x20));
    for (local_110 = 0; local_110 < lVar4; local_110 = local_110 + 1) {
      plVar5[local_110] = (long)piVar6[local_110];
    }
    MFIter::operator++((MFIter *)&stack0xffffffffffffff30);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffeb0);
  return in_RDI;
}

Assistant:

T cast (U const& mf_in)
    {
        T mf_out(mf_in.boxArray(), mf_in.DistributionMap(), mf_in.nComp(), mf_in.nGrowVect());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf_in); mfi.isValid(); ++mfi)
        {
            const Long n = mfi.fabbox().numPts() * mf_in.nComp();
            auto pdst = mf_out[mfi].dataPtr();
            auto psrc = mf_in [mfi].dataPtr();
            AMREX_HOST_DEVICE_PARALLEL_FOR_1D ( n, i,
            {
                pdst[i] = static_cast<typename U::value_type>(psrc[i]);
            });
        }
        return mf_out;
    }